

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O0

int Sle_ManComputeDelay(Gia_Man_t *p,Vec_Int_t *vCuts)

{
  int iVar1;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  Vec_Int_t *vTime;
  int DelayMax;
  int Delay;
  int iObj;
  Vec_Int_t *vCuts_local;
  Gia_Man_t *p_local;
  
  vTime._4_4_ = 0;
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_IntStart(iVar1);
  for (DelayMax = 0; DelayMax < p->nObjs; DelayMax = DelayMax + 1) {
    pObj = Gia_ManObj(p,DelayMax);
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 != 0) {
      iVar1 = Sle_ManComputeDelayOne(p,DelayMax,vCuts,p_00);
      vTime._4_4_ = Abc_MaxInt(vTime._4_4_,iVar1);
    }
  }
  Vec_IntFree(p_00);
  return vTime._4_4_;
}

Assistant:

int Sle_ManComputeDelay( Gia_Man_t * p, Vec_Int_t * vCuts )
{
    int iObj, Delay, DelayMax = 0;
    Vec_Int_t * vTime = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachAndId( p, iObj )
    {
        Delay = Sle_ManComputeDelayOne( p, iObj, vCuts, vTime );
        DelayMax = Abc_MaxInt( DelayMax, Delay );
    }
    Vec_IntFree( vTime );
    //printf( "Delay = %d.\n", DelayMax );
    return DelayMax;
}